

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitBreak(FunctionValidator *this,Break *curr)

{
  bool bVar1;
  bool local_41;
  BasicType local_34 [3];
  size_t local_28;
  char *local_20;
  Break *local_18;
  Break *curr_local;
  FunctionValidator *this_local;
  
  local_28 = (curr->name).super_IString.str._M_len;
  local_20 = (curr->name).super_IString.str._M_str;
  local_18 = curr;
  curr_local = (Break *)this;
  noteBreak(this,(Name)(curr->name).super_IString.str,curr->value,(Expression *)curr);
  if (local_18->value != (Expression *)0x0) {
    local_34[2] = 0;
    bVar1 = wasm::Type::operator!=(&local_18->value->type,local_34 + 2);
    shouldBeTrue<wasm::Break*>(this,bVar1,local_18,"break value must not have none type");
  }
  if (local_18->condition != (Expression *)0x0) {
    local_34[1] = 1;
    bVar1 = wasm::Type::operator==(&local_18->condition->type,local_34 + 1);
    local_41 = true;
    if (!bVar1) {
      local_34[0] = i32;
      local_41 = wasm::Type::operator==(&local_18->condition->type,local_34);
    }
    shouldBeTrue<wasm::Break*>(this,local_41,local_18,"break condition must be i32");
  }
  return;
}

Assistant:

void FunctionValidator::visitBreak(Break* curr) {
  noteBreak(curr->name, curr->value, curr);
  if (curr->value) {
    shouldBeTrue(curr->value->type != Type::none,
                 curr,
                 "break value must not have none type");
  }
  if (curr->condition) {
    shouldBeTrue(curr->condition->type == Type::unreachable ||
                   curr->condition->type == Type::i32,
                 curr,
                 "break condition must be i32");
  }
}